

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O2

Vec_Str_t * Gia_WriteEquivClasses(Gia_Man_t *p)

{
  uchar *pArray;
  Vec_Str_t *pVVar1;
  int nEquivSize;
  int local_c;
  
  pArray = Gia_WriteEquivClassesInt(p,&local_c);
  pVVar1 = Vec_StrAllocArray((char *)pArray,local_c);
  return pVVar1;
}

Assistant:

Vec_Str_t * Gia_WriteEquivClasses( Gia_Man_t * p )
{
    int nEquivSize;
    unsigned char * pBuffer = Gia_WriteEquivClassesInt( p, &nEquivSize );
    return Vec_StrAllocArray( (char *)pBuffer, nEquivSize );
}